

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O0

void mpifft1d_dif(int *dim,int *pdim,int ndim,int current_dim,int *pidx,int inverse,int size,
                 int *embed,cpx_t *in,cpx_t *out,plan_t plan_short,plan_t plan_long,int *rho_L,
                 int *rho_pk0,int *rho_Lk0,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                 int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  undefined8 uVar1;
  plan_t p_00;
  plan_t p_01;
  cpx_t cVar2;
  float fVar3;
  int ndim_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  cpx_t *unaff_RBX;
  int *unaff_RBP;
  long in_RSI;
  int *in_RDI;
  int *in_R8;
  int in_R9D;
  cpx_t *unaff_R12;
  int *unaff_R13;
  int *unaff_R14;
  int *unaff_R15;
  double dVar7;
  double dVar8;
  double dVar9;
  int *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  MPI_Comm in_stack_00000010;
  cpx_t *in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  undefined8 in_stack_00000060;
  undefined8 in_stack_00000070;
  undefined8 in_stack_00000078;
  int i;
  int c1;
  int rev;
  cpx_t y;
  cpx_t x;
  int r;
  double sign;
  cpx_t w;
  double theta;
  int j;
  double alpha;
  int i_1;
  int k0;
  int c;
  int stride;
  int st;
  int length;
  int p;
  MPI_Comm in_stack_fffffffffffffe80;
  cpx_t *in_stack_fffffffffffffe88;
  cpx_t *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  int local_b8;
  float local_a4;
  float fStack_a0;
  int local_9c;
  int local_7c;
  int current_dim_00;
  int iVar10;
  
  ndim_00 = in_RDI[in_ECX] / *(int *)(in_RSI + (long)in_ECX * 4);
  iVar4 = (in_stack_00000008 / *(int *)(in_stack_00000010 + (long)in_ECX * 4)) *
          (in_RDI[in_ECX] / *(int *)(in_RSI + (long)in_ECX * 4));
  iVar5 = in_stack_00000008 / *(int *)(in_stack_00000010 + (long)in_ECX * 4);
  iVar10 = ndim_00;
  for (iVar6 = *(int *)(in_RSI + (long)in_ECX * 4); 1 < iVar6; iVar6 = iVar6 / iVar10) {
    ndim_00 = iVar6;
    for (current_dim_00 = 0; current_dim_00 < iVar4 / iVar10; current_dim_00 = current_dim_00 + 1) {
      p_00.ostride = (int)in_stack_fffffffffffffea8;
      p_00.idist = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      p_00.n = (int)in_stack_fffffffffffffea0;
      p_00.istride = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
      p_00.odist = (int)in_stack_fffffffffffffeb0;
      p_00.howmany = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
      dfft_local_1dfft(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,p_00,
                       (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    }
    dVar7 = (double)(in_R8[in_ECX] % ndim_00) / (double)ndim_00;
    for (local_7c = 0; local_7c < iVar10; local_7c = local_7c + 1) {
      dVar8 = (dVar7 * -6.283185307179586) / (double)iVar10;
      dVar9 = cos((double)local_7c * dVar8);
      dVar8 = sin((double)local_7c * dVar8);
      fVar3 = -1.0;
      if (in_R9D == 0) {
        fVar3 = 1.0;
      }
      for (local_9c = 0; local_9c < iVar5; local_9c = local_9c + 1) {
        uVar1 = *(undefined8 *)
                 (CONCAT44(in_stack_00000024,in_stack_00000020) +
                 (long)(local_7c * iVar5 + local_9c) * 8);
        local_a4 = (float)uVar1;
        fStack_a0 = (float)((ulong)uVar1 >> 0x20);
        cVar2.y = local_a4 * (float)dVar8 * fVar3 + fStack_a0 * (float)dVar9;
        cVar2.x = local_a4 * (float)dVar9 + -(fStack_a0 * (float)dVar8 * fVar3);
        in_stack_00000018[local_7c * iVar5 + local_9c] = cVar2;
      }
    }
    in_stack_fffffffffffffe90 = (cpx_t *)CONCAT44(in_stack_00000024,in_stack_00000020);
    in_stack_fffffffffffffe80 = in_stack_00000010;
    in_stack_fffffffffffffe88 = in_stack_00000018;
    in_stack_fffffffffffffea0 = in_stack_00000060;
    in_stack_fffffffffffffea8 = in_stack_00000070;
    in_stack_fffffffffffffeb0 = in_stack_00000078;
    iVar6 = ndim_00;
    dfft_redistribute_cyclic_to_block_1d
              ((int *)CONCAT44(iVar10,iVar4),(int *)CONCAT44(iVar5,ndim_00),ndim_00,current_dim_00,
               (int)((ulong)dVar7 >> 0x20),SUB84(dVar7,0),in_R8,in_ECX,(int)in_RSI,in_RDI,unaff_RBX,
               unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,
               (int *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010,
               (int *)in_stack_00000018,in_stack_00000020);
  }
  for (local_b8 = 0; local_b8 < iVar4 / ndim_00; local_b8 = local_b8 + 1) {
    p_01.ostride = (int)in_stack_fffffffffffffea8;
    p_01.idist = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    p_01.n = (int)in_stack_fffffffffffffea0;
    p_01.istride = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    p_01.odist = (int)in_stack_fffffffffffffeb0;
    p_01.howmany = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    dfft_local_1dfft(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,p_01,
                     (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  }
  return;
}

Assistant:

void mpifft1d_dif(int *dim,
            int *pdim,
            int ndim,
            int current_dim,
            int* pidx,
            int inverse,
            int size,
            int *embed,
            cpx_t *in,
            cpx_t *out,
            plan_t plan_short,
            plan_t plan_long,
            int *rho_L,
            int *rho_pk0,
            int *rho_Lk0,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    int p = pdim[current_dim];
    int length = dim[current_dim]/pdim[current_dim];
    int st = size/embed[current_dim]*(dim[current_dim]/pdim[current_dim]);

    /* compute stride for column major matrix storage */
    int stride = size/embed[current_dim];

    int c;
    int k0 = length;
    for (c = p; c >1; c /= length)
        {
#if 1
        /* do local out-of-place place FFT (long-distance butterflies) */
        #ifdef FFT1D_SUPPORTS_THREADS
        dfft_local_1dfft(in, out, plan_long, inverse);
        #else
        int i;
        #pragma omp parallel for
        for (i = 0; i < st/length; ++i)
            dfft_local_1dfft(in+i, out+i, plan_long, inverse);
        #endif
        /* apply twiddle factors */
        double alpha = ((double)(pidx[current_dim] %c))/(double)c;
        int j;
        #pragma omp parallel for private(j)
        for (j = 0; j < length; j++)
            {
            double theta = -(double)2.0 * (double)M_PI * alpha/(double) length;
            cpx_t w;
            RE(w) = cos((double)j*theta);
            IM(w) = sin((double)j*theta);

            double sign = ((inverse) ? (-1.0) : 1.0);
            IM(w) *=sign;

            int r;
            for (r = 0; r < stride; ++r)
                {
                cpx_t x = out[j*stride+r];
                cpx_t y;
                RE(y) = RE(x) * RE(w) - IM(x) * IM(w);
                IM(y) = RE(x) * IM(w) + IM(x) * RE(w);

                in[j*stride+r] = y;
                }
            }
        int rev = 1;
#else
        int rev = 0;
#endif

        /* in-place redistribute from group-cyclic c -> c1 */
        int c1 = ((c > length) ? (c/length) : 1);
        k0 = c;
        dfft_redistribute_cyclic_to_block_1d(dim,pdim,ndim,current_dim, c, c1,
            pidx, rev, size, embed, in,out,rho_L,rho_pk0,
            dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
            comm, proc_map, row_m);
        }

    /* perform remaining short-distance butterflies,
     * out-of-place 1d FFT */
    #ifdef FFT1D_SUPPORTS_THREADS
    dfft_local_1dfft(in, out, plan_short,inverse);
    #else
    int i;
    #pragma omp parallel for
    for (i = 0; i < st/k0; ++i)
        dfft_local_1dfft(in+i, out+i, plan_short, inverse);
    #endif
    }